

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

int __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::setTipPartials
          (BeagleCPUImpl<float,_1,_0> *this,int tipIndex,double *inPartials)

{
  double *pdVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  uint uVar16;
  double *pdVar17;
  float *pfVar18;
  float *pfVar19;
  int iVar20;
  int iVar21;
  long lVar22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  void *ptr;
  float *local_80;
  undefined1 local_78 [64];
  
  iVar14 = -5;
  if ((-1 < tipIndex) && (tipIndex < this->kTipCount)) {
    if (this->gPartials[(uint)tipIndex] == (float *)0x0) {
      local_80 = (float *)0x0;
      posix_memalign(&local_80,0x20,(long)this->kPartialsSize << 2);
      this->gPartials[(uint)tipIndex] = local_80;
      if (this->gPartials[(uint)tipIndex] == (float *)0x0) {
        return -2;
      }
    }
    iVar14 = this->kCategoryCount;
    if (0 < iVar14) {
      pfVar19 = this->gPartials[(uint)tipIndex];
      iVar2 = this->kPatternCount;
      uVar3 = this->kStateCount;
      lVar22 = (long)(int)uVar3;
      iVar4 = this->kPartialsPaddedStateCount;
      uVar16 = (this->kPaddedPatternCount - iVar2) * iVar4;
      auVar24 = vpbroadcastq_avx512f();
      iVar21 = 0;
      auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      local_78 = vmovdqu64_avx512f(auVar24);
      do {
        if (0 < iVar2) {
          iVar20 = 0;
          pdVar17 = inPartials;
          pfVar18 = pfVar19;
          do {
            if (uVar3 != 0) {
              uVar15 = 0;
              do {
                auVar26 = vpbroadcastq_avx512f();
                auVar26 = vporq_avx512f(auVar26,auVar25);
                uVar13 = vpcmpuq_avx512f(auVar26,auVar24,2);
                pdVar1 = pdVar17 + uVar15;
                auVar26._8_8_ = (ulong)((byte)(uVar13 >> 1) & 1) * (long)pdVar1[1];
                auVar26._0_8_ = (ulong)((byte)uVar13 & 1) * (long)*pdVar1;
                auVar26._16_8_ = (ulong)((byte)(uVar13 >> 2) & 1) * (long)pdVar1[2];
                auVar26._24_8_ = (ulong)((byte)(uVar13 >> 3) & 1) * (long)pdVar1[3];
                auVar26._32_8_ = (ulong)((byte)(uVar13 >> 4) & 1) * (long)pdVar1[4];
                auVar26._40_8_ = (ulong)((byte)(uVar13 >> 5) & 1) * (long)pdVar1[5];
                auVar26._48_8_ = (ulong)((byte)(uVar13 >> 6) & 1) * (long)pdVar1[6];
                auVar26._56_8_ = (uVar13 >> 7) * (long)pdVar1[7];
                auVar23 = vcvtpd2ps_avx512f(auVar26);
                pfVar19 = pfVar18 + uVar15;
                bVar5 = (bool)((byte)uVar13 & 1);
                bVar6 = (bool)((byte)(uVar13 >> 1) & 1);
                bVar7 = (bool)((byte)(uVar13 >> 2) & 1);
                bVar8 = (bool)((byte)(uVar13 >> 3) & 1);
                bVar9 = (bool)((byte)(uVar13 >> 4) & 1);
                bVar10 = (bool)((byte)(uVar13 >> 5) & 1);
                bVar11 = (bool)((byte)(uVar13 >> 6) & 1);
                bVar12 = SUB81(uVar13 >> 7,0);
                *pfVar19 = (float)((uint)bVar5 * auVar23._0_4_ | (uint)!bVar5 * (int)*pfVar19);
                pfVar19[1] = (float)((uint)bVar6 * auVar23._4_4_ | (uint)!bVar6 * (int)pfVar19[1]);
                pfVar19[2] = (float)((uint)bVar7 * auVar23._8_4_ | (uint)!bVar7 * (int)pfVar19[2]);
                pfVar19[3] = (float)((uint)bVar8 * auVar23._12_4_ | (uint)!bVar8 * (int)pfVar19[3]);
                pfVar19[4] = (float)((uint)bVar9 * auVar23._16_4_ | (uint)!bVar9 * (int)pfVar19[4]);
                pfVar19[5] = (float)((uint)bVar10 * auVar23._20_4_ | (uint)!bVar10 * (int)pfVar19[5]
                                    );
                pfVar19[6] = (float)((uint)bVar11 * auVar23._24_4_ | (uint)!bVar11 * (int)pfVar19[6]
                                    );
                pfVar19[7] = (float)((uint)bVar12 * auVar23._28_4_ | (uint)!bVar12 * (int)pfVar19[7]
                                    );
                uVar15 = uVar15 + 8;
              } while (((ulong)uVar3 + 7 & 0xfffffffffffffff8) != uVar15);
            }
            pfVar19 = pfVar18 + lVar22;
            if ((int)uVar3 < iVar4) {
              memset(pfVar19,0,(ulong)(~uVar3 + iVar4) * 4 + 4);
              auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              auVar24 = vmovdqu64_avx512f(local_78);
              pfVar19 = pfVar18 + (ulong)(~uVar3 + iVar4) + lVar22 + 1;
            }
            iVar20 = iVar20 + 1;
            pdVar17 = pdVar17 + lVar22;
            pfVar18 = pfVar19;
          } while (iVar20 != iVar2);
        }
        if (0 < (int)uVar16) {
          memset(pfVar19,0,(ulong)uVar16 * 4);
          auVar25 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
          auVar24 = vmovdqu64_avx512f(local_78);
          pfVar19 = pfVar19 + (ulong)(uVar16 - 1) + 1;
        }
        iVar21 = iVar21 + 1;
      } while (iVar21 != iVar14);
    }
    iVar14 = 0;
  }
  return iVar14;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::setTipPartials(int tipIndex,
                                  const double* inPartials) {
    if (tipIndex < 0 || tipIndex >= kTipCount)
        return BEAGLE_ERROR_OUT_OF_RANGE;
    if(gPartials[tipIndex] == NULL) {
        gPartials[tipIndex] = (REALTYPE*) mallocAligned(sizeof(REALTYPE) * kPartialsSize);
        // TODO: What if this throws a memory full error?
        if (gPartials[tipIndex] == 0L)
            return BEAGLE_ERROR_OUT_OF_MEMORY;
    }

    const double* inPartialsOffset;
    REALTYPE* tmpRealPartialsOffset = gPartials[tipIndex];
    for (int l = 0; l < kCategoryCount; l++) {
        inPartialsOffset = inPartials;
        for (int i = 0; i < kPatternCount; i++) {
            beagleMemCpy(tmpRealPartialsOffset, inPartialsOffset, kStateCount);
            tmpRealPartialsOffset += kStateCount;
            // Pad extra buffer with zeros
            for(int k = kStateCount; k < kPartialsPaddedStateCount; k++) {
                *tmpRealPartialsOffset++ = 0;
            }
            inPartialsOffset += kStateCount;
        }
        // Pad extra buffer with zeros
        for(int k = 0; k < kPartialsPaddedStateCount * (kPaddedPatternCount - kPatternCount); k++) {
            *tmpRealPartialsOffset++ = 0;
        }
    }

    return BEAGLE_SUCCESS;
}